

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaLinCon.cpp
# Opt level: O3

void __thiscall
NaLinearUnitsChain::NaLinearUnitsChain(NaLinearUnitsChain *this,NaLinearUnitsChain *rUnitsChain)

{
  int iVar1;
  NaLinearUnit *this_00;
  undefined4 extraout_var;
  uint uVar2;
  
  (this->super_NaDynAr<NaLinearUnit>)._vptr_NaDynAr = (_func_int **)&PTR__NaDynAr_00173ca8;
  (this->super_NaDynAr<NaLinearUnit>).nItems = 0;
  (this->super_NaDynAr<NaLinearUnit>).pHead = (item *)0x0;
  (this->super_NaDynAr<NaLinearUnit>).pTail = (item *)0x0;
  NaUnit::NaUnit(&this->super_NaUnit,1,1,0);
  NaConfigPart::NaConfigPart(&this->super_NaConfigPart,&rUnitsChain->super_NaConfigPart);
  (this->super_NaDynAr<NaLinearUnit>)._vptr_NaDynAr =
       (_func_int **)&PTR__NaLinearUnitsChain_00174370;
  (this->super_NaUnit).super_NaLogging._vptr_NaLogging = (_func_int **)&PTR_PrintLog_00174458;
  (this->super_NaConfigPart)._vptr_NaConfigPart = (_func_int **)&PTR__NaLinearUnitsChain_001744c8;
  uVar2 = 0;
  while( true ) {
    iVar1 = (*(rUnitsChain->super_NaDynAr<NaLinearUnit>)._vptr_NaDynAr[3])(rUnitsChain);
    if (iVar1 <= (int)uVar2) break;
    this_00 = (NaLinearUnit *)operator_new(0x90);
    iVar1 = (*(rUnitsChain->super_NaDynAr<NaLinearUnit>)._vptr_NaDynAr[0x11])
                      (rUnitsChain,(ulong)uVar2);
    NaLinearUnit::NaLinearUnit(this_00,(NaLinearUnit *)CONCAT44(extraout_var,iVar1));
    (*(this->super_NaDynAr<NaLinearUnit>)._vptr_NaDynAr[4])(this,this_00);
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

NaLinearUnitsChain::NaLinearUnitsChain (const NaLinearUnitsChain& rUnitsChain)
:   NaConfigPart(rUnitsChain)
{
    int i;
    for(i = 0; i < rUnitsChain.count(); ++i)
        addh(new NaLinearUnit(rUnitsChain.get(i)));
}